

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NeuralNetworkClassifier::ByteSizeLong(NeuralNetworkClassifier *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  Type *this_01;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar6 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  uVar7 = (ulong)uVar6;
  uVar8 = 0;
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,uVar8);
      sVar4 = NeuralNetworkLayer::ByteSizeLong(this_00);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = uVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  uVar6 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = uVar7 + uVar6;
  if ((ulong)uVar6 != 0) {
    uVar8 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                          (&(this->preprocessing_).super_RepeatedPtrFieldBase,uVar8);
      sVar5 = NeuralNetworkPreprocessing::ByteSizeLong(this_01);
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  sVar1 = ((this->labelprobabilitylayername_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar6 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  if (this->updateparams_ != (NetworkUpdateParameters *)0x0 &&
      this != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) {
    sVar5 = NetworkUpdateParameters::ByteSizeLong(this->updateparams_);
    uVar6 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar6 = this->arrayinputshapemapping_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar7;
  }
  uVar6 = this->imageinputshapemapping_;
  if (uVar6 != 0) {
    if ((int)uVar6 < 0) {
      uVar7 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar6 | 1) != 0) {
        for (; (uVar6 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar7;
  }
  if (this->_oneof_case_[0] == 0x65) {
    sVar5 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[0] != 100) goto LAB_004ad18e;
    sVar5 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar6 = (uint)sVar5 | 1;
  iVar2 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
LAB_004ad18e:
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t NeuralNetworkClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkClassifier)
  size_t total_size = 0;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  {
    unsigned int count = this->preprocessing_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->preprocessing(i));
    }
  }

  // string labelProbabilityLayerName = 200;
  if (this->labelprobabilitylayername().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->labelprobabilitylayername());
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updateparams_);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->arrayinputshapemapping());
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->imageinputshapemapping());
  }

  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}